

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O0

int process_wait(process_info_t *vec,int n,int timeout)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  fd_set *__arr;
  undefined1 local_138 [4];
  uint __i;
  fd_set fds;
  timeval tv;
  timeval timebase;
  undefined1 local_90 [4];
  uint elapsed_ms;
  pthread_attr_t attr;
  pthread_t tid;
  dowait_args args;
  process_info_t *p;
  int local_28;
  int retval;
  int r;
  int i;
  int timeout_local;
  int n_local;
  process_info_t *vec_local;
  
  tid._0_4_ = -1;
  tid._4_4_ = -1;
  args.pipe = (int  [2])vec;
  args.vec._0_4_ = n;
  if (timeout == -1) {
    dowait(&tid);
    vec_local._4_4_ = 0;
  }
  else {
    iVar1 = pipe((int *)&tid);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_init((pthread_attr_t *)local_90);
      if (iVar1 != 0) {
        abort();
      }
      iVar1 = pthread_attr_setstacksize((pthread_attr_t *)local_90,0x40000);
      if (iVar1 != 0) {
        abort();
      }
      iVar1 = pthread_create((pthread_t *)(attr.__size + 0x30),(pthread_attr_t *)local_90,dowait,
                             &tid);
      iVar2 = pthread_attr_destroy((pthread_attr_t *)local_90);
      if (iVar2 != 0) {
        abort();
      }
      if (iVar1 == 0) {
        iVar1 = gettimeofday((timeval *)&tv.tv_usec,(__timezone_ptr_t)0x0);
        if (iVar1 != 0) {
          abort();
        }
        fds.fds_bits[0xf] = tv.tv_usec;
        tv.tv_sec = timebase.tv_sec;
        while( true ) {
          if ((fds.fds_bits[0xf] <= tv.tv_usec) &&
             ((fds.fds_bits[0xf] != tv.tv_usec || (tv.tv_sec < timebase.tv_sec)))) {
            __assert_fail("tv.tv_sec > timebase.tv_sec || (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/runner-unix.c"
                          ,300,"int process_wait(process_info_t *, int, int)");
          }
          uVar3 = (((int)fds.fds_bits[0xf] - (int)tv.tv_usec) * 1000 + (int)(tv.tv_sec / 1000)) -
                  (int)(timebase.tv_sec / 1000);
          local_28 = 0;
          if ((uint)timeout <= uVar3) break;
          fds.fds_bits[0xf] = (ulong)(timeout - uVar3) / 1000;
          tv.tv_sec = (ulong)(((timeout - uVar3) % 1000) * 1000);
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            *(undefined8 *)(local_138 + (ulong)__arr._4_4_ * 8) = 0;
          }
          *(ulong *)(local_138 + (long)((int)tid / 0x40) * 8) =
               1L << ((byte)((long)(int)tid % 0x40) & 0x3f) |
               *(ulong *)(local_138 + (long)((int)tid / 0x40) * 8);
          local_28 = select((int)tid + 1,(fd_set *)local_138,(fd_set *)0x0,(fd_set *)0x0,
                            (timeval *)(fds.fds_bits + 0xf));
          if ((local_28 != -1) || (piVar4 = __errno_location(), *piVar4 != 4)) break;
          iVar1 = gettimeofday((timeval *)(fds.fds_bits + 0xf),(__timezone_ptr_t)0x0);
          if (iVar1 != 0) {
            abort();
          }
        }
        if (local_28 == -1) {
          perror("select()");
          p._4_4_ = -1;
        }
        else if (local_28 == 0) {
          for (retval = 0; retval < n; retval = retval + 1) {
            args._16_8_ = vec + retval;
            kill(((process_info_t *)args._16_8_)->pid,0xf);
          }
          p._4_4_ = -2;
        }
        else {
          p._4_4_ = 0;
        }
        iVar1 = pthread_join(attr._48_8_,(void **)0x0);
        if (iVar1 != 0) {
          abort();
        }
      }
      else {
        perror("pthread_create()");
        p._4_4_ = -1;
      }
      closefd((int)tid);
      closefd(tid._4_4_);
      vec_local._4_4_ = p._4_4_;
    }
    else {
      perror("pipe()");
      vec_local._4_4_ = -1;
    }
  }
  return vec_local._4_4_;
}

Assistant:

int process_wait(process_info_t* vec, int n, int timeout) {
  int i;
  int r;
  int retval;
  process_info_t* p;
  dowait_args args;
  pthread_t tid;
  pthread_attr_t attr;
  unsigned int elapsed_ms;
  struct timeval timebase;
  struct timeval tv;
  fd_set fds;

  args.vec = vec;
  args.n = n;
  args.pipe[0] = -1;
  args.pipe[1] = -1;

  /* The simple case is where there is no timeout */
  if (timeout == -1) {
    dowait(&args);
    return 0;
  }

  /* Hard case. Do the wait with a timeout.
   *
   * Assumption: we are the only ones making this call right now. Otherwise
   * we'd need to lock vec.
   */

  r = pipe((int*)&(args.pipe));
  if (r) {
    perror("pipe()");
    return -1;
  }

  if (pthread_attr_init(&attr))
    abort();

#if defined(__MVS__)
  if (pthread_attr_setstacksize(&attr, 1024 * 1024))
#else
  if (pthread_attr_setstacksize(&attr, 256 * 1024))
#endif
    abort();

  r = pthread_create(&tid, &attr, dowait, &args);

  if (pthread_attr_destroy(&attr))
    abort();

  if (r) {
    perror("pthread_create()");
    retval = -1;
    goto terminate;
  }

  if (gettimeofday(&timebase, NULL))
    abort();

  tv = timebase;
  for (;;) {
    /* Check that gettimeofday() doesn't jump back in time. */
    assert(tv.tv_sec > timebase.tv_sec ||
           (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec));

    elapsed_ms =
        (tv.tv_sec - timebase.tv_sec) * 1000 +
        (tv.tv_usec / 1000) -
        (timebase.tv_usec / 1000);

    r = 0;  /* Timeout. */
    if (elapsed_ms >= (unsigned) timeout)
      break;

    tv.tv_sec = (timeout - elapsed_ms) / 1000;
    tv.tv_usec = (timeout - elapsed_ms) % 1000 * 1000;

    FD_ZERO(&fds);
    FD_SET(args.pipe[0], &fds);

    r = select(args.pipe[0] + 1, &fds, NULL, NULL, &tv);
    if (!(r == -1 && errno == EINTR))
      break;

    if (gettimeofday(&tv, NULL))
      abort();
  }

  if (r == -1) {
    perror("select()");
    retval = -1;

  } else if (r) {
    /* The thread completed successfully. */
    retval = 0;

  } else {
    /* Timeout. Kill all the children. */
    for (i = 0; i < n; i++) {
      p = &vec[i];
      kill(p->pid, SIGTERM);
    }
    retval = -2;
  }

  if (pthread_join(tid, NULL))
    abort();

terminate:
  closefd(args.pipe[0]);
  closefd(args.pipe[1]);
  return retval;
}